

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

char * __thiscall Fl_Type::class_name(Fl_Type *this,int need_nest)

{
  int iVar1;
  char *pcVar2;
  char *local_30;
  char *q;
  Fl_Type *p;
  int need_nest_local;
  Fl_Type *this_local;
  
  q = (char *)this->parent;
  while( true ) {
    if (q == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = (**(code **)(*(long *)q + 0x130))();
    if (iVar1 != 0) break;
    q = *(char **)(q + 0x38);
  }
  local_30 = (char *)0x0;
  if (need_nest != 0) {
    local_30 = class_name((Fl_Type *)q,need_nest);
  }
  if (local_30 != (char *)0x0) {
    if (local_30 != class_name::s) {
      fl_strlcpy(class_name::s,local_30,0x100);
    }
    fl_strlcat(class_name::s,"::",0x100);
    pcVar2 = name((Fl_Type *)q);
    fl_strlcat(class_name::s,pcVar2,0x100);
    return class_name::s;
  }
  pcVar2 = name((Fl_Type *)q);
  return pcVar2;
}

Assistant:

const char* Fl_Type::class_name(const int need_nest) const {
  Fl_Type* p = parent;
  while (p) {
    if (p->is_class()) {
      // see if we are nested in another class, we must fully-qualify name:
      // this is lame but works...
      const char* q = 0;
      if(need_nest) q=p->class_name(need_nest);
      if (q) {
	static char s[256];
	if (q != s) strlcpy(s, q, sizeof(s));
	strlcat(s, "::", sizeof(s));
	strlcat(s, p->name(), sizeof(s));
	return s;
      }
      return p->name();
    }
    p = p->parent;
  }
  return 0;
}